

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
Imf_3_2::CompositeDeepScanLine::addSource(CompositeDeepScanLine *this,DeepScanLineInputPart *part)

{
  vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
  *in_RSI;
  value_type *in_RDI;
  Header *in_stack_00000078;
  Data *in_stack_00000080;
  
  DeepScanLineInputPart::header((DeepScanLineInputPart *)0x17a8eb);
  Data::check_valid(in_stack_00000080,in_stack_00000078);
  std::vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>::
  push_back(in_RSI,in_RDI);
  return;
}

Assistant:

void
CompositeDeepScanLine::addSource (DeepScanLineInputPart* part)
{
    _Data->check_valid (part->header ());
    _Data->_part.push_back (part);
}